

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_DefaultConstructor_Test<pica::Particle<(pica::Dimension)2>_>::TestBody
          (ParticleTest_DefaultConstructor_Test<pica::Particle<(pica::Dimension)2>_> *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int d_2;
  AssertionResult gtest_ar_1;
  int d_1;
  AssertionResult gtest_ar;
  int d;
  ParticleType particle;
  Particle<(pica::Dimension)2> *in_stack_fffffffffffffe10;
  double *in_stack_fffffffffffffe18;
  Particle<(pica::Dimension)2> *in_stack_fffffffffffffe20;
  double *in_stack_fffffffffffffe28;
  int line;
  char *in_stack_fffffffffffffe30;
  double *in_stack_fffffffffffffe38;
  Type type;
  Particle<(pica::Dimension)2> *in_stack_fffffffffffffe40;
  Message *in_stack_fffffffffffffe68;
  Message *message;
  AssertHelper *in_stack_fffffffffffffe70;
  AssertionResult local_160 [2];
  Vector3<double> local_140;
  Vector3<double> local_128;
  AssertionResult local_110;
  int local_fc;
  Vector3<double> local_e8;
  Vector3<double> local_d0;
  AssertionResult local_b8;
  int local_a8;
  uint local_a4;
  PositionType local_80;
  Vector2<double> local_70;
  AssertionResult local_60;
  int local_4c;
  Particle<(pica::Dimension)2> local_48;
  
  pica::Particle<(pica::Dimension)2>::Particle(in_stack_fffffffffffffe10);
  local_4c = 0;
  while( true ) {
    if (1 < local_4c) {
      local_a8 = 0;
      while( true ) {
        if (2 < local_a8) {
          local_fc = 0;
          while( true ) {
            type = (Type)((ulong)in_stack_fffffffffffffe38 >> 0x20);
            if (2 < local_fc) {
              pica::Particle<(pica::Dimension)2>::getFactor(&local_48);
              testing::internal::EqHelper<false>::Compare<double,double>
                        ((char *)in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                         in_stack_fffffffffffffe18,(double *)in_stack_fffffffffffffe10);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_160);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffffe40);
                in_stack_fffffffffffffe18 =
                     (double *)
                     testing::AssertionResult::failure_message((AssertionResult *)0x1f4b20);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffffe40,type,in_stack_fffffffffffffe30,
                           (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                           (char *)in_stack_fffffffffffffe20);
                testing::internal::AssertHelper::operator=
                          (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffffe10);
                testing::Message::~Message((Message *)0x1f4b74);
              }
              local_a4 = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f4bf8);
              if (local_a4 == 0) {
                message = (Message *)0x3ff0000000000000;
                pica::Particle<(pica::Dimension)2>::getGamma(&local_48);
                testing::internal::EqHelper<false>::Compare<double,double>
                          ((char *)in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                           in_stack_fffffffffffffe18,(double *)in_stack_fffffffffffffe10);
                line = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)&stack0xfffffffffffffe70);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffffe40);
                  this_00 = (AssertHelper *)
                            testing::AssertionResult::failure_message((AssertionResult *)0x1f4c8a);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffffe40,type,
                             in_stack_fffffffffffffe30,line,(char *)in_stack_fffffffffffffe20);
                  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe70,message);
                  testing::internal::AssertHelper::~AssertHelper(this_00);
                  testing::Message::~Message((Message *)0x1f4cd8);
                }
                local_a4 = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f4d50);
              }
              return;
            }
            pica::Vector3<double>::Vector3(&local_128);
            in_stack_fffffffffffffe28 = pica::Vector3<double>::operator[](&local_128,local_fc);
            pica::Particle<(pica::Dimension)2>::getVelocity(in_stack_fffffffffffffe20);
            pica::Vector3<double>::operator[](&local_140,local_fc);
            testing::internal::EqHelper<false>::Compare<double,double>
                      ((char *)in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                       in_stack_fffffffffffffe18,(double *)in_stack_fffffffffffffe10);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_110);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffe40);
              in_stack_fffffffffffffe20 =
                   (Particle<(pica::Dimension)2> *)
                   testing::AssertionResult::failure_message((AssertionResult *)0x1f497d);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffffe40,
                         (Type)((ulong)in_stack_fffffffffffffe38 >> 0x20),in_stack_fffffffffffffe30,
                         (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                         (char *)in_stack_fffffffffffffe20);
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffffe10);
              testing::Message::~Message((Message *)0x1f49da);
            }
            local_a4 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f4a5e);
            if (local_a4 != 0) break;
            local_fc = local_fc + 1;
          }
          return;
        }
        pica::Vector3<double>::Vector3(&local_d0);
        in_stack_fffffffffffffe38 = pica::Vector3<double>::operator[](&local_d0,local_a8);
        pica::Particle<(pica::Dimension)2>::getMomentum(in_stack_fffffffffffffe40);
        pica::Vector3<double>::operator[](&local_e8,local_a8);
        testing::internal::EqHelper<false>::Compare<double,double>
                  ((char *)in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                   in_stack_fffffffffffffe18,(double *)in_stack_fffffffffffffe10);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe40);
          in_stack_fffffffffffffe30 =
               testing::AssertionResult::failure_message((AssertionResult *)0x1f47a1);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe40,
                     (Type)((ulong)in_stack_fffffffffffffe38 >> 0x20),in_stack_fffffffffffffe30,
                     (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                     (char *)in_stack_fffffffffffffe20);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
          testing::Message::~Message((Message *)0x1f47fe);
        }
        local_a4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f4882);
        if (local_a4 != 0) break;
        local_a8 = local_a8 + 1;
      }
      return;
    }
    pica::Vector2<double>::Vector2(&local_70);
    pica::Vector2<double>::operator[](&local_70,local_4c);
    local_80 = pica::Particle<(pica::Dimension)2>::getPosition(&local_48);
    pica::Vector2<double>::operator[](&local_80,local_4c);
    testing::internal::EqHelper<false>::Compare<double,double>
              ((char *)in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
               in_stack_fffffffffffffe18,(double *)in_stack_fffffffffffffe10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe40);
      in_stack_fffffffffffffe40 =
           (Particle<(pica::Dimension)2> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x1f45c5);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffe40,
                 (Type)((ulong)in_stack_fffffffffffffe38 >> 0x20),in_stack_fffffffffffffe30,
                 (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),(char *)in_stack_fffffffffffffe20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
      testing::Message::~Message((Message *)0x1f4622);
    }
    local_a4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f46a6);
    if (local_a4 != 0) break;
    local_4c = local_4c + 1;
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, DefaultConstructor)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    ParticleType particle;
    ASSERT_EQ_VECTOR(PositionType(), particle.getPosition(), this->dimension);
    ASSERT_EQ_VECTOR(MomentumType(), particle.getMomentum(), this->momentumDimension);
    ASSERT_EQ_VECTOR(MomentumType(), particle.getVelocity(), this->momentumDimension);
    ASSERT_EQ(static_cast<FactorType>(1.0), particle.getFactor());
    ASSERT_EQ(static_cast<GammaType>(1.0), particle.getGamma());
}